

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)

{
  char16_t *string;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t **ppcVar4;
  size_t sVar5;
  StorageInfo *this;
  uint uVar6;
  int index;
  uint uVar7;
  WCHAR local_248 [4];
  char16 filename [260];
  
  uVar6 = infoMap.count - infoMap.freeCount;
  if (infoMap.count != infoMap.freeCount) {
    uVar7 = 0;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    do {
      ppcVar4 = JsUtil::
                BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(&infoMap,index);
      string = *ppcVar4;
      if (string != (char16_t *)0x0) {
        sVar5 = PAL_wcslen(string);
        Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t_const>
                  ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar5 + 1,string);
        this = JsUtil::
               BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(&infoMap,index);
        if (this->isFileStorage == true) {
          if (useCacheDir == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x1dc,"(useCacheDir)","useCacheDir");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
          }
          if (deleteFileStorage) {
            StorageInfo::GetFilename(this,local_248);
            DeleteFileW(local_248);
          }
        }
        else {
          DeleteRecord((this->field_1).record);
        }
        uVar7 = uVar7 + 1;
      }
      index = index + 1;
    } while (uVar7 < uVar6);
  }
  JsUtil::
  BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&infoMap);
  return;
}

Assistant:

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)
{
    uint recordCount = infoMap.Count();
    uint recordFreed = 0;
    for (uint i = 0; recordFreed < recordCount; i++)
    {
        char16 const * name = infoMap.GetKeyAt(i);
        if (name == nullptr)
        {
            continue;
        }
        NoCheckHeapDeleteArray(wcslen(name) + 1, name);

        StorageInfo const& info = infoMap.GetValueAt(i);
        if (info.isFileStorage)
        {
            AssertOrFailFast(useCacheDir);
            if (deleteFileStorage)
            {
                char16 filename[_MAX_PATH];
                info.GetFilename(filename);
                _wunlink(filename);
            }
        }
        else
        {
            DeleteRecord(info.record);
        }

        recordFreed++;
    }
    infoMap.Clear();
}